

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O0

int try_connect(NetSocket *sock)

{
  Plug *p;
  uint16_t uVar1;
  int iVar2;
  int *piVar3;
  size_t sVar4;
  char *msg;
  int local_72c;
  int local_728;
  int local_724;
  undefined1 local_720 [8];
  SockAddr thisaddr_2;
  SockAddr thisaddr_1;
  int retcode;
  int b_2;
  int b_1;
  int b;
  SockAddr thisaddr;
  int family;
  int salen;
  short localport;
  sockaddr *psStack_a0;
  int err;
  sockaddr_union *sa;
  sockaddr_union u;
  NetSocket *pNStack_10;
  int s;
  NetSocket *sock_local;
  
  salen = 0;
  pNStack_10 = sock;
  del234(sktree,sock);
  if (-1 < pNStack_10->s) {
    close(pNStack_10->s);
  }
  sk_extractaddr_tmp((SockAddr *)&b_1,pNStack_10->addr,&pNStack_10->step);
  plug_log(pNStack_10->plug,0,(SockAddr *)&b_1,pNStack_10->port,(char *)0x0,0);
  if (pNStack_10->addr->superfamily == UNRESOLVED) {
    local_724 = 0;
  }
  else {
    if (pNStack_10->addr->superfamily == UNIX) {
      local_728 = 1;
    }
    else {
      if ((pNStack_10->step).ai == (addrinfo *)0x0) {
        local_72c = 2;
      }
      else {
        local_72c = ((pNStack_10->step).ai)->ai_family;
      }
      local_728 = local_72c;
    }
    local_724 = local_728;
  }
  thisaddr.hostname[0x1f8] = (undefined1)local_724;
  thisaddr.hostname[0x1f9] = local_724._1_1_;
  thisaddr.hostname[0x1fa] = local_724._2_1_;
  thisaddr.hostname[0x1fb] = local_724._3_1_;
  if (local_724 == 0) {
    __assert_fail("family != AF_UNSPEC",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/network.c"
                  ,0x241,"int try_connect(NetSocket *)");
  }
  u.storage.__ss_align._4_4_ = socket(local_724,1,0);
  pNStack_10->s = u.storage.__ss_align._4_4_;
  if ((int)u.storage.__ss_align._4_4_ < 0) {
    piVar3 = __errno_location();
    salen = *piVar3;
  }
  else {
    cloexec(u.storage.__ss_align._4_4_);
    if ((pNStack_10->oobinline & 1U) != 0) {
      b_2 = 1;
      iVar2 = setsockopt(u.storage.__ss_align._4_4_,1,10,&b_2,4);
      if (iVar2 < 0) {
        piVar3 = __errno_location();
        salen = *piVar3;
        close(u.storage.__ss_align._4_4_);
        goto LAB_00171484;
      }
    }
    if (((pNStack_10->nodelay & 1U) != 0) && (thisaddr.hostname._504_4_ != 1)) {
      retcode = 1;
      iVar2 = setsockopt(u.storage.__ss_align._4_4_,6,1,&retcode,4);
      if (iVar2 < 0) {
        piVar3 = __errno_location();
        salen = *piVar3;
        close(u.storage.__ss_align._4_4_);
        goto LAB_00171484;
      }
    }
    if ((pNStack_10->keepalive & 1U) != 0) {
      thisaddr_1.hostname[0x1fc] = '\x01';
      thisaddr_1.hostname[0x1fd] = '\0';
      thisaddr_1.hostname[0x1fe] = '\0';
      thisaddr_1.hostname[0x1ff] = '\0';
      iVar2 = setsockopt(u.storage.__ss_align._4_4_,1,9,thisaddr_1.hostname + 0x1fc,4);
      if (iVar2 < 0) {
        piVar3 = __errno_location();
        salen = *piVar3;
        close(u.storage.__ss_align._4_4_);
        goto LAB_00171484;
      }
    }
    if ((pNStack_10->privport & 1U) == 0) {
      family._2_2_ = 0;
    }
    else {
      family._2_2_ = 0x3ff;
    }
    memset(&sa,0,0x80);
    if (thisaddr.hostname._504_4_ != 1) {
      while( true ) {
        if (thisaddr.hostname._504_4_ == 10) {
          sa._0_2_ = 10;
          u._0_8_ = _in6addr_any;
          u._8_1_ = flock;
          u._9_1_ = flock_1;
          u._10_1_ = uRam000000000020520a;
          u._11_1_ = uRam000000000020520b;
          u._12_1_ = uRam000000000020520c;
          u._13_1_ = uRam000000000020520d;
          u._14_1_ = uRam000000000020520e;
          u._15_1_ = uRam000000000020520f;
          sa._2_2_ = htons(family._2_2_);
          thisaddr_1.hostname._504_4_ = bind(u.storage.__ss_align._4_4_,(sockaddr *)&sa,0x1c);
        }
        else {
          if (thisaddr.hostname._504_4_ != 2) {
            __assert_fail("family == AF_INET",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/network.c"
                          ,0x286,"int try_connect(NetSocket *)");
          }
          sa._0_2_ = 2;
          sa._4_4_ = htonl(0);
          sa._2_2_ = htons(family._2_2_);
          thisaddr_1.hostname._504_4_ = bind(u.storage.__ss_align._4_4_,(sockaddr *)&sa,0x10);
        }
        if (-1 < (int)thisaddr_1.hostname._504_4_) break;
        piVar3 = __errno_location();
        salen = *piVar3;
        if (((salen != 0x62) || (family._2_2_ == 0)) ||
           (family._2_2_ = family._2_2_ - 1, family._2_2_ == 0)) goto LAB_0017127a;
      }
      salen = 0;
LAB_0017127a:
      if (salen != 0) goto LAB_00171484;
    }
    if (thisaddr.hostname._504_4_ == 1) {
      sVar4 = strlen(pNStack_10->addr->hostname);
      if (0x6b < sVar4) {
        __assert_fail("strlen(sock->addr->hostname) < sizeof u.su.sun_path",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/network.c"
                      ,700,"int try_connect(NetSocket *)");
      }
      sa._0_2_ = 1;
      strcpy((char *)((long)&sa + 2),pNStack_10->addr->hostname);
      psStack_a0 = (sockaddr *)&sa;
      thisaddr.hostname[0x1fc] = 'n';
      thisaddr.hostname[0x1fd] = '\0';
      thisaddr.hostname[0x1fe] = '\0';
      thisaddr.hostname[0x1ff] = '\0';
    }
    else if (thisaddr.hostname._504_4_ == 2) {
      uVar1 = htons((uint16_t)pNStack_10->port);
      *(uint16_t *)((pNStack_10->step).ai)->ai_addr->sa_data = uVar1;
      psStack_a0 = (sockaddr *)((pNStack_10->step).ai)->ai_addr;
      thisaddr.hostname._508_4_ = ((pNStack_10->step).ai)->ai_addrlen;
    }
    else {
      if (thisaddr.hostname._504_4_ != 10) {
        __assert_fail("false && \"unknown address family\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/network.c"
                      ,0x2c4,"int try_connect(NetSocket *)");
      }
      uVar1 = htons((uint16_t)pNStack_10->port);
      *(uint16_t *)((pNStack_10->step).ai)->ai_addr->sa_data = uVar1;
      psStack_a0 = (sockaddr *)((pNStack_10->step).ai)->ai_addr;
      thisaddr.hostname._508_4_ = ((pNStack_10->step).ai)->ai_addrlen;
    }
    nonblock(u.storage.__ss_align._4_4_);
    iVar2 = connect(u.storage.__ss_align._4_4_,psStack_a0,thisaddr.hostname._508_4_);
    if (iVar2 < 0) {
      piVar3 = __errno_location();
      if (*piVar3 != 0x73) {
        piVar3 = __errno_location();
        salen = *piVar3;
        goto LAB_00171484;
      }
    }
    else {
      pNStack_10->connected = true;
      pNStack_10->writable = true;
      sk_extractaddr_tmp((SockAddr *)(thisaddr_2.hostname + 0x1f8),pNStack_10->addr,
                         &pNStack_10->step);
      plug_log(pNStack_10->plug,2,(SockAddr *)(thisaddr_2.hostname + 0x1f8),pNStack_10->port,
               (char *)0x0,0);
    }
    uxsel_tell(pNStack_10);
  }
LAB_00171484:
  add234(sktree,pNStack_10);
  if (salen != 0) {
    sk_extractaddr_tmp((SockAddr *)local_720,pNStack_10->addr,&pNStack_10->step);
    p = pNStack_10->plug;
    iVar2 = pNStack_10->port;
    msg = strerror(salen);
    plug_log(p,1,(SockAddr *)local_720,iVar2,msg,salen);
  }
  return salen;
}

Assistant:

static int try_connect(NetSocket *sock)
{
    int s;
    union sockaddr_union u;
    const union sockaddr_union *sa;
    int err = 0;
    short localport;
    int salen, family;

    /*
     * Remove the socket from the tree before we overwrite its
     * internal socket id, because that forms part of the tree's
     * sorting criterion. We'll add it back before exiting this
     * function, whether we changed anything or not.
     */
    del234(sktree, sock);

    if (sock->s >= 0)
        close(sock->s);

    {
        SockAddr thisaddr = sk_extractaddr_tmp(
            sock->addr, &sock->step);
        plug_log(sock->plug, PLUGLOG_CONNECT_TRYING,
                 &thisaddr, sock->port, NULL, 0);
    }

    /*
     * Open socket.
     */
    family = SOCKADDR_FAMILY(sock->addr, sock->step);
    assert(family != AF_UNSPEC);
    s = socket(family, SOCK_STREAM, 0);
    sock->s = s;

    if (s < 0) {
        err = errno;
        goto ret;
    }

    cloexec(s);

    if (sock->oobinline) {
        int b = 1;
        if (setsockopt(s, SOL_SOCKET, SO_OOBINLINE,
                       (void *) &b, sizeof(b)) < 0) {
            err = errno;
            close(s);
            goto ret;
        }
    }

    if (sock->nodelay && family != AF_UNIX) {
        int b = 1;
        if (setsockopt(s, IPPROTO_TCP, TCP_NODELAY,
                       (void *) &b, sizeof(b)) < 0) {
            err = errno;
            close(s);
            goto ret;
        }
    }

    if (sock->keepalive) {
        int b = 1;
        if (setsockopt(s, SOL_SOCKET, SO_KEEPALIVE,
                       (void *) &b, sizeof(b)) < 0) {
            err = errno;
            close(s);
            goto ret;
        }
    }

    /*
     * Bind to local address.
     */
    if (sock->privport)
        localport = 1023;              /* count from 1023 downwards */
    else
        localport = 0;                 /* just use port 0 (ie kernel picks) */

    /* BSD IP stacks need sockaddr_in zeroed before filling in */
    memset(&u,'\0',sizeof(u));

    /* We don't try to bind to a local address for UNIX domain sockets.  (Why
     * do we bother doing the bind when localport == 0 anyway?) */
    if (family != AF_UNIX) {
        /* Loop round trying to bind */
        while (1) {
            int retcode;

#ifndef NO_IPV6
            if (family == AF_INET6) {
                /* XXX use getaddrinfo to get a local address? */
                u.sin6.sin6_family = AF_INET6;
                u.sin6.sin6_addr = in6addr_any;
                u.sin6.sin6_port = htons(localport);
                retcode = bind(s, &u.sa, sizeof(u.sin6));
            } else
#endif
            {
                assert(family == AF_INET);
                u.sin.sin_family = AF_INET;
                u.sin.sin_addr.s_addr = htonl(INADDR_ANY);
                u.sin.sin_port = htons(localport);
                retcode = bind(s, &u.sa, sizeof(u.sin));
            }
            if (retcode >= 0) {
                err = 0;
                break;                 /* done */
            } else {
                err = errno;
                if (err != EADDRINUSE) /* failed, for a bad reason */
                  break;
            }

            if (localport == 0)
              break;                   /* we're only looping once */
            localport--;
            if (localport == 0)
              break;                   /* we might have got to the end */
        }

        if (err)
            goto ret;
    }

    /*
     * Connect to remote address.
     */
    switch(family) {
#ifndef NO_IPV6
      case AF_INET:
        /* XXX would be better to have got getaddrinfo() to fill in the port. */
        ((struct sockaddr_in *)sock->step.ai->ai_addr)->sin_port =
            htons(sock->port);
        sa = (const union sockaddr_union *)sock->step.ai->ai_addr;
        salen = sock->step.ai->ai_addrlen;
        break;
      case AF_INET6:
        ((struct sockaddr_in *)sock->step.ai->ai_addr)->sin_port =
            htons(sock->port);
        sa = (const union sockaddr_union *)sock->step.ai->ai_addr;
        salen = sock->step.ai->ai_addrlen;
        break;
#else
      case AF_INET:
        u.sin.sin_family = AF_INET;
        u.sin.sin_addr.s_addr = htonl(sock->addr->addresses[sock->step.curraddr]);
        u.sin.sin_port = htons((short) sock->port);
        sa = &u;
        salen = sizeof u.sin;
        break;
#endif
      case AF_UNIX:
        assert(strlen(sock->addr->hostname) < sizeof u.su.sun_path);
        u.su.sun_family = AF_UNIX;
        strcpy(u.su.sun_path, sock->addr->hostname);
        sa = &u;
        salen = sizeof u.su;
        break;

      default:
        unreachable("unknown address family");
        exit(1); /* XXX: GCC doesn't understand assert() on some systems. */
    }

    nonblock(s);

    if ((connect(s, &(sa->sa), salen)) < 0) {
        if ( errno != EINPROGRESS ) {
            err = errno;
            goto ret;
        }
    } else {
        /*
         * If we _don't_ get EWOULDBLOCK, the connect has completed
         * and we should set the socket as connected and writable.
         */
        sock->connected = true;
        sock->writable = true;

        SockAddr thisaddr = sk_extractaddr_tmp(sock->addr, &sock->step);
        plug_log(sock->plug, PLUGLOG_CONNECT_SUCCESS,
                 &thisaddr, sock->port, NULL, 0);
    }

    uxsel_tell(sock);

    ret:

    /*
     * No matter what happened, put the socket back in the tree.
     */
    add234(sktree, sock);

    if (err) {
        SockAddr thisaddr = sk_extractaddr_tmp(
            sock->addr, &sock->step);
        plug_log(sock->plug, PLUGLOG_CONNECT_FAILED,
                 &thisaddr, sock->port, strerror(err), err);
    }
    return err;
}